

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

int __thiscall
re2::RE2::ProgramFanout
          (RE2 *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *histogram)

{
  mapped_type *pmVar1;
  long lVar2;
  int iVar3;
  pointer pIVar4;
  SparseArray<int> fanout;
  int local_44;
  SparseArray<int> local_40;
  
  if (this->prog_ == (Prog *)0x0) {
    iVar3 = -1;
  }
  else {
    SparseArray<int>::SparseArray(&local_40,this->prog_->size_);
    Prog::Fanout(this->prog_,&local_40);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
             *)histogram);
    if (local_40.size_ != 0) {
      pIVar4 = local_40.dense_.
               super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar3 = 0;
        do {
          local_44 = iVar3;
          iVar3 = local_44 + 1;
        } while (1 << ((byte)local_44 & 0x1f) < pIVar4->second);
        pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](histogram,&local_44);
        *pmVar1 = *pmVar1 + 1;
        pIVar4 = pIVar4 + 1;
      } while (pIVar4 != local_40.dense_.
                         super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_40.size_);
    }
    lVar2 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(histogram + 8));
    iVar3 = *(int *)(lVar2 + 0x20);
    SparseArray<int>::~SparseArray(&local_40);
  }
  return iVar3;
}

Assistant:

int RE2::ProgramFanout(map<int, int>* histogram) const {
  if (prog_ == NULL)
    return -1;
  SparseArray<int> fanout(prog_->size());
  prog_->Fanout(&fanout);
  histogram->clear();
  for (SparseArray<int>::iterator i = fanout.begin(); i != fanout.end(); ++i) {
    // TODO(junyer): Optimise this?
    int bucket = 0;
    while (1 << bucket < i->second) {
      bucket++;
    }
    (*histogram)[bucket]++;
  }
  return histogram->rbegin()->first;
}